

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncFunction.h
# Opt level: O2

void __thiscall
Js::JavascriptAsyncSpawnStepFunction::JavascriptAsyncSpawnStepFunction
          (JavascriptAsyncSpawnStepFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          JavascriptGenerator *generator,Var argument,Var resolve,Var reject,bool isReject)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_013958d8;
  Memory::WriteBarrierPtr<Js::JavascriptGenerator>::WriteBarrierSet(&this->generator,generator);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->reject,reject);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->resolve,resolve);
  this->isReject = isReject;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->argument,argument);
  return;
}

Assistant:

JavascriptAsyncSpawnStepFunction(
        DynamicType* type,
        FunctionInfo* functionInfo,
        JavascriptGenerator* generator,
        Var argument,
        Var resolve = nullptr,
        Var reject = nullptr,
        bool isReject = false) :
            RuntimeFunction(type, functionInfo),
            generator(generator),
            argument(argument),
            resolve(resolve),
            reject(reject),
            isReject(isReject) {}